

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall
r_exec::Group::inject_hlps
          (Group *this,vector<r_exec::View_*,_std::allocator<r_exec::View_*>_> *views)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Code *pCVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CSTController *pCVar5;
  long lVar6;
  long lVar7;
  DebugStream *pDVar8;
  undefined4 extraout_var_01;
  mapped_type *pmVar9;
  MDLController *c_00;
  Group *pGVar10;
  uint64_t ijt;
  reference ppVVar11;
  Controller *pCVar12;
  P *this_00;
  View *pVVar13;
  _Self local_148;
  _Base_ptr local_140;
  _Rb_tree_const_iterator<core::P<r_exec::View>_> local_138;
  const_iterator v;
  __normal_iterator<r_exec::View_**,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
  local_128;
  View **local_120;
  MDLController *local_118;
  MDLController *c_1;
  uint64_t uStack_108;
  bool inject_in_secondary_group;
  DebugStream local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  string local_b1;
  CSTController *local_b0;
  CSTController *c;
  DebugStream local_a0 [39];
  allocator local_79;
  string local_78 [35];
  string local_55 [17];
  undefined4 local_44;
  Atom a;
  iterator iStack_40;
  __normal_iterator<r_exec::View_**,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
  local_38;
  View **local_30;
  __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
  local_28;
  const_iterator view;
  lock_guard<std::mutex> guard;
  vector<r_exec::View_*,_std::allocator<r_exec::View_*>_> *views_local;
  Group *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&view,&this->mutex);
  __gnu_cxx::
  __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
  ::__normal_iterator(&local_28);
  local_38._M_current =
       (View **)std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>::begin(views);
  __gnu_cxx::
  __normal_iterator<r_exec::View*const*,std::vector<r_exec::View*,std::allocator<r_exec::View*>>>::
  __normal_iterator<r_exec::View**>
            ((__normal_iterator<r_exec::View*const*,std::vector<r_exec::View*,std::allocator<r_exec::View*>>>
              *)&local_30,&local_38);
  local_28._M_current = local_30;
  while( true ) {
    iStack_40 = std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>::end(views);
    bVar1 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffc0);
    if (!bVar1) break;
    ppVVar11 = __gnu_cxx::
               __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
               ::operator*(&local_28);
    pCVar4 = core::P<r_code::Code>::operator->(&((*ppVVar11)->super_View).object);
    iVar3 = (*(pCVar4->super__Object)._vptr__Object[4])(pCVar4,0);
    local_44 = *(undefined4 *)CONCAT44(extraout_var,iVar3);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x33) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"group inject hlp",&local_79);
      ::debug(local_55);
      lVar6 = (*Now)();
      lVar7 = r_code::Utils::GetTimeReference();
      DebugStream::timestamp_abi_cxx11_(local_a0,lVar6 - lVar7);
      pDVar8 = DebugStream::operator<<((DebugStream *)local_55,(string *)local_a0);
      pDVar8 = DebugStream::operator<<(pDVar8," -> cst ");
      ppVVar11 = __gnu_cxx::
                 __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                 ::operator*(&local_28);
      pCVar4 = core::P<r_code::Code>::operator->(&((*ppVVar11)->super_View).object);
      iVar3 = (*(pCVar4->super__Object)._vptr__Object[2])();
      DebugStream::operator<<(pDVar8,CONCAT44(extraout_var_00,iVar3));
      std::__cxx11::string::~string((string *)local_a0);
      DebugStream::~DebugStream((DebugStream *)local_55);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      ppVVar11 = __gnu_cxx::
                 __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                 ::operator*(&local_28);
      pVVar13 = *ppVVar11;
      ppVVar11 = __gnu_cxx::
                 __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                 ::operator*(&local_28);
      c = (CSTController *)View::get_oid(*ppVVar11);
      pmVar9 = std::
               unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
               ::operator[](&this->ipgm_views,(key_type *)&c);
      core::P<r_exec::View>::operator=(pmVar9,pVVar13);
      pCVar5 = (CSTController *)operator_new(0x1e8);
      ppVVar11 = __gnu_cxx::
                 __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                 ::operator*(&local_28);
      CSTController::CSTController(pCVar5,&(*ppVVar11)->super_View);
      local_b0 = pCVar5;
      ppVVar11 = __gnu_cxx::
                 __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                 ::operator*(&local_28);
      core::P<r_exec::Controller>::operator=(&(*ppVVar11)->controller,(Controller *)pCVar5);
      pCVar5 = local_b0;
      pGVar10 = get_secondary_group(this);
      CSTController::set_secondary_host(pCVar5,pGVar10);
    }
    else if (cVar2 == -0x32) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"group inject hlp",&local_d9);
      ::debug(&local_b1);
      lVar6 = (*Now)();
      lVar7 = r_code::Utils::GetTimeReference();
      DebugStream::timestamp_abi_cxx11_(local_100,lVar6 - lVar7);
      pDVar8 = DebugStream::operator<<((DebugStream *)&local_b1,(string *)local_100);
      pDVar8 = DebugStream::operator<<(pDVar8," -> mdl ");
      ppVVar11 = __gnu_cxx::
                 __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                 ::operator*(&local_28);
      pCVar4 = core::P<r_code::Code>::operator->(&((*ppVVar11)->super_View).object);
      iVar3 = (*(pCVar4->super__Object)._vptr__Object[2])();
      DebugStream::operator<<(pDVar8,CONCAT44(extraout_var_01,iVar3));
      std::__cxx11::string::~string((string *)local_100);
      DebugStream::~DebugStream((DebugStream *)&local_b1);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      ppVVar11 = __gnu_cxx::
                 __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                 ::operator*(&local_28);
      pVVar13 = *ppVVar11;
      ppVVar11 = __gnu_cxx::
                 __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                 ::operator*(&local_28);
      uStack_108 = View::get_oid(*ppVVar11);
      pmVar9 = std::
               unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
               ::operator[](&this->ipgm_views,&stack0xfffffffffffffef8);
      core::P<r_exec::View>::operator=(pmVar9,pVVar13);
      ppVVar11 = __gnu_cxx::
                 __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                 ::operator*(&local_28);
      c_00 = MDLController::New(*ppVVar11,(bool *)((long)&c_1 + 7));
      local_118 = c_00;
      ppVVar11 = __gnu_cxx::
                 __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                 ::operator*(&local_28);
      core::P<r_exec::Controller>::operator=(&(*ppVVar11)->controller,(Controller *)c_00);
      if ((c_1._7_1_ & 1) != 0) {
        pGVar10 = get_secondary_group(this);
        ppVVar11 = __gnu_cxx::
                   __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                   ::operator*(&local_28);
        inject_secondary_mdl_controller(pGVar10,*ppVVar11);
      }
    }
    ppVVar11 = __gnu_cxx::
               __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
               ::operator*(&local_28);
    pVVar13 = *ppVVar11;
    ijt = (*Now)();
    r_code::View::set_ijt(&pVVar13->super_View,ijt);
    r_code::Atom::~Atom((Atom *)&local_44);
    __gnu_cxx::
    __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
    ::operator++(&local_28);
  }
  local_128._M_current =
       (View **)std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>::begin(views);
  __gnu_cxx::
  __normal_iterator<r_exec::View*const*,std::vector<r_exec::View*,std::allocator<r_exec::View*>>>::
  __normal_iterator<r_exec::View**>
            ((__normal_iterator<r_exec::View*const*,std::vector<r_exec::View*,std::allocator<r_exec::View*>>>
              *)&local_120,&local_128);
  local_28._M_current = local_120;
  while( true ) {
    v._M_node = (_Base_ptr)std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>::end(views);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<r_exec::View_**,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                        *)&v);
    if (!bVar1) break;
    ppVVar11 = __gnu_cxx::
               __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
               ::operator*(&local_28);
    bVar1 = is_active_pgm(this,*ppVVar11);
    if (bVar1) {
      ppVVar11 = __gnu_cxx::
                 __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                 ::operator*(&local_28);
      pCVar12 = core::P<r_exec::Controller>::operator->(&(*ppVVar11)->controller);
      (*(pCVar12->super__Object)._vptr__Object[5])();
      std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::_Rb_tree_const_iterator(&local_138);
      local_140 = (_Base_ptr)
                  std::
                  multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
                  ::begin(&this->newly_salient_views);
      local_138._M_node = local_140;
      while( true ) {
        local_148._M_node =
             (_Base_ptr)
             std::
             multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
             ::end(&this->newly_salient_views);
        bVar1 = std::operator!=(&local_138,&local_148);
        if (!bVar1) break;
        ppVVar11 = __gnu_cxx::
                   __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
                   ::operator*(&local_28);
        pCVar12 = core::P<r_exec::Controller>::operator->(&(*ppVVar11)->controller);
        this_00 = (P *)std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator*(&local_138);
        pVVar13 = core::P::operator_cast_to_View_(this_00);
        Controller::_take_input(pCVar12,pVVar13);
        std::_Rb_tree_const_iterator<core::P<r_exec::View>_>::operator++(&local_138);
      }
    }
    __gnu_cxx::
    __normal_iterator<r_exec::View_*const_*,_std::vector<r_exec::View_*,_std::allocator<r_exec::View_*>_>_>
    ::operator++(&local_28);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&view);
  return;
}

Assistant:

void Group::inject_hlps(std::vector<View *> &views)
{
    std::lock_guard<std::mutex> guard(mutex);
    std::vector<View *>::const_iterator view;

    for (view = views.begin(); view != views.end(); ++view) {
        Atom a = (*view)->object->code(0);

        switch (a.getDescriptor()) {
        case Atom::COMPOSITE_STATE: {
            debug("group inject hlp") << DebugStream::timestamp(Now() - Utils::GetTimeReference()) << " -> cst " << (*view)->object->get_oid();
            ipgm_views[(*view)->get_oid()] = *view;
            CSTController *c = new CSTController(*view);
            (*view)->controller = c;
            c->set_secondary_host(get_secondary_group());
            break;
        }

        case Atom::MODEL: {
            debug("group inject hlp") << DebugStream::timestamp(Now() - Utils::GetTimeReference()) << " -> mdl " << (*view)->object->get_oid();
            ipgm_views[(*view)->get_oid()] = *view;
            bool inject_in_secondary_group;
            MDLController *c = MDLController::New(*view, inject_in_secondary_group);
            (*view)->controller = c;

            if (inject_in_secondary_group) {
                get_secondary_group()->inject_secondary_mdl_controller(*view);
            }

            break;
        }
        }

        (*view)->set_ijt(Now());
    }

    for (view = views.begin(); view != views.end(); ++view) {
        if (is_active_pgm(*view)) {
            (*view)->controller->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                (*view)->controller->_take_input(*v);    // view will be copied.
            }
        }
    }
}